

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.c
# Opt level: O1

void * kmpc_aligned_malloc(size_t size,size_t alignment)

{
  int iVar1;
  void *pvVar2;
  int *piVar3;
  void *pvVar4;
  
  if ((alignment & alignment - 1) == 0) {
    iVar1 = __kmp_get_global_thread_id_reg();
    pvVar2 = bget(__kmp_threads[iVar1],alignment + size + 8);
    if (pvVar2 != (void *)0x0) {
      pvVar4 = (void *)(-alignment & (long)pvVar2 + alignment + 8);
      *(void **)((long)pvVar4 + -8) = pvVar2;
      return pvVar4;
    }
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
  }
  return (void *)0x0;
}

Assistant:

void *
kmpc_aligned_malloc( size_t size, size_t alignment )
{
    void * ptr;
    void * ptr_allocated;
    KMP_DEBUG_ASSERT( alignment < 32 * 1024 ); // Alignment should not be too big
    if( !IS_POWER_OF_TWO(alignment) ) {
        // AC: do we need to issue a warning here?
        errno = EINVAL;
        return NULL;
    }
    size = size + sizeof( void* ) + alignment;
    ptr_allocated = bget( __kmp_entry_thread(), (bufsize)size );
    if( ptr_allocated != NULL ) {
        // save allocated pointer just before one returned to user
        ptr = (void*)(((kmp_uintptr_t)ptr_allocated + sizeof( void* ) + alignment) & ~(alignment - 1));
        *((void**)ptr - 1) = ptr_allocated;
    } else {
        ptr = NULL;
    }
    return ptr;
}